

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlRegStatePtr pxVar3;
  int iVar4;
  xmlRegexpPtr comp;
  void *pvVar5;
  xmlChar **ppxVar6;
  void *pvVar7;
  xmlChar *pxVar8;
  int *piVar9;
  xmlRegTrans *pxVar10;
  xmlRegTransPtr trans;
  xmlRegStatePtr state;
  int prev;
  int targetno;
  int atomno;
  int stateno;
  xmlChar *value;
  xmlChar **stringMap;
  void **transdata;
  int *transitions;
  int *stringRemap;
  int *stateRemap;
  int nbatoms;
  int nbstates;
  int j;
  int i;
  xmlRegexpPtr ret;
  xmlRegParserCtxtPtr ctxt_local;
  
  comp = (xmlRegexpPtr)(*xmlMalloc)(0x68);
  if (comp == (xmlRegexpPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"compiling regexp");
    return (xmlRegexpPtr)0x0;
  }
  memset(comp,0,0x68);
  comp->string = ctxt->string;
  comp->nbStates = ctxt->nbStates;
  comp->states = ctxt->states;
  comp->nbAtoms = ctxt->nbAtoms;
  comp->atoms = ctxt->atoms;
  comp->nbCounters = ctxt->nbCounters;
  comp->counters = ctxt->counters;
  comp->determinist = ctxt->determinist;
  comp->flags = ctxt->flags;
  if (comp->determinist == -1) {
    xmlRegexpIsDeterminist(comp);
  }
  if (((((comp->determinist != 0) && (comp->nbCounters == 0)) && (ctxt->negs == 0)) &&
      ((comp->atoms != (xmlRegAtomPtr *)0x0 && (*comp->atoms != (xmlRegAtomPtr)0x0)))) &&
     ((*comp->atoms)->type == XML_REGEXP_STRING)) {
    stateRemap._4_4_ = 0;
    stateRemap._0_4_ = 0;
    pvVar5 = (*xmlMalloc)((long)comp->nbStates << 2);
    if (pvVar5 == (void *)0x0) {
      xmlRegexpErrMemory(ctxt,"compiling regexp");
      (*xmlFree)(comp);
      return (xmlRegexpPtr)0x0;
    }
    for (nbstates = 0; nbstates < comp->nbStates; nbstates = nbstates + 1) {
      if (comp->states[nbstates] == (xmlRegStatePtr)0x0) {
        *(undefined4 *)((long)pvVar5 + (long)nbstates * 4) = 0xffffffff;
      }
      else {
        *(int *)((long)pvVar5 + (long)nbstates * 4) = stateRemap._4_4_;
        stateRemap._4_4_ = stateRemap._4_4_ + 1;
      }
    }
    ppxVar6 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 3);
    if (ppxVar6 == (xmlChar **)0x0) {
      xmlRegexpErrMemory(ctxt,"compiling regexp");
      (*xmlFree)(pvVar5);
      (*xmlFree)(comp);
      return (xmlRegexpPtr)0x0;
    }
    pvVar7 = (*xmlMalloc)((long)comp->nbAtoms << 2);
    if (pvVar7 == (void *)0x0) {
      xmlRegexpErrMemory(ctxt,"compiling regexp");
      (*xmlFree)(ppxVar6);
      (*xmlFree)(pvVar5);
      (*xmlFree)(comp);
      return (xmlRegexpPtr)0x0;
    }
    for (nbstates = 0; nbstates < comp->nbAtoms; nbstates = nbstates + 1) {
      if ((comp->atoms[nbstates]->type != XML_REGEXP_STRING) ||
         (comp->atoms[nbstates]->quant != XML_REGEXP_QUANT_ONCE)) {
        (*xmlFree)(pvVar5);
        (*xmlFree)(pvVar7);
        for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
          (*xmlFree)(ppxVar6[nbstates]);
        }
        (*xmlFree)(ppxVar6);
        (*xmlFree)(comp);
        return (xmlRegexpPtr)0x0;
      }
      pxVar8 = (xmlChar *)comp->atoms[nbstates]->valuep;
      for (nbatoms = 0; nbatoms < (int)stateRemap; nbatoms = nbatoms + 1) {
        iVar4 = xmlStrEqual(ppxVar6[nbatoms],pxVar8);
        if (iVar4 != 0) {
          *(int *)((long)pvVar7 + (long)nbstates * 4) = nbatoms;
          break;
        }
      }
      if ((int)stateRemap <= nbatoms) {
        *(int *)((long)pvVar7 + (long)nbstates * 4) = (int)stateRemap;
        pxVar8 = xmlStrdup(pxVar8);
        ppxVar6[(int)stateRemap] = pxVar8;
        if (ppxVar6[(int)stateRemap] == (xmlChar *)0x0) {
          for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
            (*xmlFree)(ppxVar6[nbstates]);
          }
          (*xmlFree)(pvVar7);
          (*xmlFree)(ppxVar6);
          (*xmlFree)(pvVar5);
          (*xmlFree)(comp);
          return (xmlRegexpPtr)0x0;
        }
        stateRemap._0_4_ = (int)stateRemap + 1;
      }
    }
    piVar9 = (int *)xmlRegCalloc2((long)(stateRemap._4_4_ + 1),(long)((int)stateRemap + 1),4);
    if (piVar9 == (int *)0x0) {
      (*xmlFree)(pvVar5);
      (*xmlFree)(pvVar7);
      for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
        (*xmlFree)(ppxVar6[nbstates]);
      }
      (*xmlFree)(ppxVar6);
      (*xmlFree)(comp);
      return (xmlRegexpPtr)0x0;
    }
    stringMap = (xmlChar **)0x0;
    for (nbstates = 0; nbstates < comp->nbStates; nbstates = nbstates + 1) {
      iVar4 = *(int *)((long)pvVar5 + (long)nbstates * 4);
      if (iVar4 != -1) {
        pxVar3 = comp->states[nbstates];
        piVar9[iVar4 * ((int)stateRemap + 1)] = pxVar3->type;
        for (nbatoms = 0; nbatoms < pxVar3->nbTrans; nbatoms = nbatoms + 1) {
          pxVar10 = pxVar3->trans + nbatoms;
          if ((pxVar10->to != -1) && (pxVar10->atom != (xmlRegAtomPtr)0x0)) {
            iVar1 = *(int *)((long)pvVar7 + (long)pxVar10->atom->no * 4);
            if ((pxVar10->atom->data != (void *)0x0) &&
               ((stringMap == (xmlChar **)0x0 &&
                (stringMap = (xmlChar **)
                             xmlRegCalloc2((long)stateRemap._4_4_,(long)(int)stateRemap,8),
                stringMap == (xmlChar **)0x0)))) {
              xmlRegexpErrMemory(ctxt,"compiling regexp");
              break;
            }
            iVar2 = *(int *)((long)pvVar5 + (long)pxVar10->to * 4);
            if (piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] == 0) {
              piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] = iVar2 + 1;
              if (stringMap != (xmlChar **)0x0) {
                stringMap[iVar4 * (int)stateRemap + iVar1] = (xmlChar *)pxVar10->atom->data;
              }
            }
            else if (piVar9[iVar4 * ((int)stateRemap + 1) + iVar1 + 1] != iVar2 + 1) {
              comp->determinist = 0;
              if (stringMap != (xmlChar **)0x0) {
                (*xmlFree)(stringMap);
              }
              (*xmlFree)(piVar9);
              (*xmlFree)(pvVar5);
              (*xmlFree)(pvVar7);
              for (nbstates = 0; nbstates < (int)stateRemap; nbstates = nbstates + 1) {
                (*xmlFree)(ppxVar6[nbstates]);
              }
              (*xmlFree)(ppxVar6);
              goto LAB_001fc423;
            }
          }
        }
      }
    }
    comp->determinist = 1;
    if (comp->states != (xmlRegStatePtr *)0x0) {
      for (nbstates = 0; nbstates < comp->nbStates; nbstates = nbstates + 1) {
        xmlRegFreeState(comp->states[nbstates]);
      }
      (*xmlFree)(comp->states);
    }
    comp->states = (xmlRegStatePtr *)0x0;
    comp->nbStates = 0;
    if (comp->atoms != (xmlRegAtomPtr *)0x0) {
      for (nbstates = 0; nbstates < comp->nbAtoms; nbstates = nbstates + 1) {
        xmlRegFreeAtom(comp->atoms[nbstates]);
      }
      (*xmlFree)(comp->atoms);
    }
    comp->atoms = (xmlRegAtomPtr *)0x0;
    comp->nbAtoms = 0;
    comp->compact = piVar9;
    comp->transdata = stringMap;
    comp->stringMap = ppxVar6;
    comp->nbstrings = (int)stateRemap;
    comp->nbstates = stateRemap._4_4_;
    (*xmlFree)(pvVar5);
    (*xmlFree)(pvVar7);
  }
LAB_001fc423:
  ctxt->string = (xmlChar *)0x0;
  ctxt->nbStates = 0;
  ctxt->states = (xmlRegStatePtr *)0x0;
  ctxt->nbAtoms = 0;
  ctxt->atoms = (xmlRegAtomPtr *)0x0;
  ctxt->nbCounters = 0;
  ctxt->counters = (xmlRegCounter *)0x0;
  return comp;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "compiling regexp");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        xmlRegexpIsDeterminist(ret);
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d states\n", nbstates);
#endif
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d atoms\n", nbatoms);
#endif
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to == -1) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt, "compiling regexp");
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
#ifdef DEBUG_COMPACTION
			printf("Indet: state %d trans %d, atom %d to %d : %d to %d\n",
			       i, j, trans->atom->no, trans->to, atomno, targetno);
			printf("       previous to is %d\n", prev);
#endif
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
#if 0
		    printf("State %d trans %d: atom %d to %d : %d to %d\n",
			   i, j, trans->atom->no, trans->to, atomno, targetno);
#endif
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
#ifdef DEBUG_COMPACTION
	/*
	 * Debug
	 */
	for (i = 0;i < nbstates;i++) {
	    for (j = 0;j < nbatoms + 1;j++) {
                printf("%02d ", transitions[i * (nbatoms + 1) + j]);
	    }
	    printf("\n");
	}
	printf("\n");
#endif
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}